

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessStop
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  string *this_00;
  pointer pbVar1;
  ErrorCode EVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Interpreter *this_01;
  CommissionerAppPtr commissioner;
  CommissionerAppPtr local_b8;
  Error local_a0;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  paVar3 = &(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_dataplus._M_p = (pointer)paVar3;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_b8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_b8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            (&local_a0,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_b8);
  local_78._0_4_ = local_a0.mCode;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_a0.mMessage._M_dataplus._M_p,
             local_a0.mMessage._M_dataplus._M_p + local_a0.mMessage._M_string_length);
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  this_01 = (Interpreter *)local_50;
  pbVar1 = (pointer)(local_50 + 0x10);
  local_50._8_8_ = (pointer)0x0;
  local_50[0x10] = '\0';
  (__return_storage_ptr__->mError).mCode = local_78._0_4_;
  local_50._0_8_ = pbVar1;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)this_01);
  EVar2 = (__return_storage_ptr__->mError).mCode;
  if ((pointer)local_50._0_8_ != pbVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.mMessage._M_dataplus._M_p != &local_a0.mMessage.field_2) {
    operator_delete(local_a0.mMessage._M_dataplus._M_p);
  }
  if (EVar2 == kNone) {
    ProcessStopJob((Value *)local_78,this_01,&local_b8,(Expression *)paVar3);
    (__return_storage_ptr__->mError).mCode = local_78._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)local_50);
    if ((pointer)local_50._0_8_ != pbVar1) {
      operator_delete((void *)local_50._0_8_);
    }
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p);
    }
  }
  if (local_b8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStop(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    value = ProcessStopJob(commissioner, aExpr);
exit:
    return value;
}